

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O1

void throughput_server(char *addr,size_t msgsize,int count)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  char *fmt;
  int iVar6;
  float fVar7;
  float fVar8;
  undefined8 local_40;
  nng_msg *msg;
  nng_socket s;
  
  iVar1 = nng_pair1_open((long)&msg + 4);
  if (iVar1 == 0) {
    iVar1 = nng_socket_set_int(msg._4_4_,"recv-buffer",0x80);
    if (iVar1 == 0) {
      iVar1 = nng_listen(msg._4_4_,addr,0,0);
      if (iVar1 == 0) {
        iVar1 = nng_recvmsg(msg._4_4_,&local_40,0);
        if (iVar1 == 0) {
          nng_msg_free(local_40);
          lVar2 = nng_clock();
          if (0 < count) {
            iVar6 = count;
            do {
              iVar1 = nng_recvmsg(msg._4_4_,&local_40,0);
              if (iVar1 != 0) goto LAB_001020f3;
              sVar3 = nng_msg_len(local_40);
              if (sVar3 != msgsize) {
                uVar5 = nng_msg_len(local_40);
                die("wrong message size: %lu != %lu",uVar5,msgsize);
              }
              nng_msg_free();
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          lVar4 = nng_clock();
          nng_send(msg._4_4_,"",0,0);
          nng_msleep(200);
          nng_socket_close(msg._4_4_);
          fVar7 = (float)(ulong)(lVar4 - lVar2) / 1000.0;
          fVar8 = (float)count / fVar7;
          printf("total time: %.3f [s]\n",(double)fVar7);
          printf("message size: %d [B]\n",msgsize & 0xffffffff);
          printf("message count: %d\n",(ulong)(uint)count);
          printf("throughput: %.f [msg/s]\n",(double)fVar8);
          printf("throughput: %.3f [Mb/s]\n",(double)(fVar8 * 8.0 * (float)msgsize * 9.536743e-07));
          return;
        }
LAB_001020f3:
        uVar5 = nng_strerror(iVar1);
        fmt = "nng_recvmsg: %s";
      }
      else {
        uVar5 = nng_strerror(iVar1);
        fmt = "nng_listen: %s";
      }
    }
    else {
      uVar5 = nng_strerror(iVar1);
      fmt = "nng_socket_set(nng_opt_recvbuf): %s";
    }
  }
  else {
    uVar5 = nng_strerror(iVar1);
    fmt = "nng_socket: %s";
  }
  die(fmt,uVar5);
}

Assistant:

void
throughput_server(const char *addr, size_t msgsize, int count)
{
	nng_socket s;
	nng_msg   *msg;
	int        rv;
	int        i;
	uint64_t   start, end;
	float      msgpersec, mbps, total;

	if ((rv = nng_pair1_open(&s)) != 0) {
		die("nng_socket: %s", nng_strerror(rv));
	}
	rv = nng_socket_set_int(s, NNG_OPT_RECVBUF, 128);
	if (rv != 0) {
		die("nng_socket_set(nng_opt_recvbuf): %s", nng_strerror(rv));
	}

	// XXX: set no delay
	// XXX: other options (TLS in the future?, Linger?)

	if ((rv = nng_listen(s, addr, NULL, 0)) != 0) {
		die("nng_listen: %s", nng_strerror(rv));
	}

	// Receive first synchronization message.
	if ((rv = nng_recvmsg(s, &msg, 0)) != 0) {
		die("nng_recvmsg: %s", nng_strerror(rv));
	}
	nng_msg_free(msg);
	start = nng_clock();

	for (i = 0; i < count; i++) {
		if ((rv = nng_recvmsg(s, &msg, 0)) != 0) {
			die("nng_recvmsg: %s", nng_strerror(rv));
		}
		if (nng_msg_len(msg) != msgsize) {
			die("wrong message size: %lu != %lu", nng_msg_len(msg),
			    msgsize);
		}
		nng_msg_free(msg);
	}
	end = nng_clock();
	// Send a synchronization message (empty) to the other side,
	// and wait a bit to make sure it goes out the wire.
	nng_send(s, "", 0, 0);
	nng_msleep(200);
	nng_socket_close(s);
	total     = (float) ((end - start)) / 1000;
	msgpersec = (float) (count) / total;
	mbps      = (float) (msgpersec * 8 * msgsize) / (1024 * 1024);
	printf("total time: %.3f [s]\n", total);
	printf("message size: %d [B]\n", (int) msgsize);
	printf("message count: %d\n", count);
	printf("throughput: %.f [msg/s]\n", msgpersec);
	printf("throughput: %.3f [Mb/s]\n", mbps);
}